

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O0

bool myutils::create_cmd_sock_pair(SOCKET *server,SOCKET *client)

{
  uint16_t uVar1;
  int iVar2;
  SOCKET SVar3;
  char *pcVar4;
  int port;
  allocator local_65;
  socklen_t local_64;
  string local_60 [8];
  string ip;
  socklen_t local_3c;
  undefined1 local_38 [4];
  socklen_t addr_len;
  sockaddr_in addr;
  int v;
  SOCKET sock;
  SOCKET *client_local;
  SOCKET *server_local;
  
  addr.sin_zero._4_4_ = socket(2,1,0);
  if (addr.sin_zero._4_4_ == -1) {
    server_local._7_1_ = false;
  }
  else {
    addr.sin_zero[0] = '\x01';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    setsockopt(addr.sin_zero._4_4_,1,2,addr.sin_zero,4);
    memset(local_38,0,0x10);
    local_38._0_2_ = 2;
    addr_len = inet_addr("127.0.0.1");
    local_38._2_2_ = 0;
    iVar2 = bind(addr.sin_zero._4_4_,(sockaddr *)local_38,0x10);
    if (iVar2 == 0) {
      listen(addr.sin_zero._4_4_,1);
      local_3c = 0x10;
      getsockname(addr.sin_zero._4_4_,(sockaddr *)local_38,&local_3c);
      local_64 = addr_len;
      pcVar4 = inet_ntoa((in_addr)addr_len);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar4,&local_65);
      std::allocator<char>::~allocator((allocator<char> *)&local_65);
      uVar1 = ntohs(local_38._2_2_);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SVar3 = connect_socket(pcVar4,(uint)uVar1);
      *client = SVar3;
      if (*client == 0) {
        close(addr.sin_zero._4_4_);
        server_local._7_1_ = false;
      }
      else {
        iVar2 = accept(addr.sin_zero._4_4_,(sockaddr *)local_38,&local_3c);
        *server = iVar2;
        if (*server == 0) {
          close(addr.sin_zero._4_4_);
          close(*client);
          server_local._7_1_ = false;
        }
        else {
          set_socket_nonblock(*server,true);
          close(addr.sin_zero._4_4_);
          server_local._7_1_ = true;
        }
      }
      std::__cxx11::string::~string(local_60);
    }
    else {
      close(addr.sin_zero._4_4_);
      server_local._7_1_ = false;
    }
  }
  return server_local._7_1_;
}

Assistant:

bool create_cmd_sock_pair(SOCKET* server, SOCKET* client)
    {
        SOCKET sock = socket(AF_INET, SOCK_STREAM, 0);
        if (sock == INVALID_SOCKET) return false;

        int v = 1;
        setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&v, sizeof(v));

        sockaddr_in addr;
        memset(&addr, 0, sizeof(addr));
        addr.sin_family = AF_INET;
        addr.sin_addr.s_addr = inet_addr("127.0.0.1");
        addr.sin_port = 0;

        if (::bind(sock, (sockaddr*)&addr, sizeof(addr)) != 0) {
            //LOG(FATAL) << "Error binding socket, ec: " << WSAGetLastError();
            closesocket(sock);
            return false;
        }

        listen(sock, 1);
        socklen_t addr_len = sizeof(addr);
        getsockname(sock, (sockaddr*)&addr, &addr_len);
        ////LOG(INFO) << "socks turnel server listen at " << inet_ntoa(addr.sin_addr) << ":" << ntohs(addr.sin_port);

        string ip = inet_ntoa(addr.sin_addr);
        int port = ntohs(addr.sin_port);
        *client = myutils::connect_socket(ip.c_str(), port);
        //CHECK(*client != INVALID_SOCKET);
        if (!*client) {
            closesocket(sock);
            return false;
        }

        *server = accept(sock, (sockaddr*)&addr, &addr_len);
        if (!*server) {
            closesocket(sock);
            closesocket(*client);
            return false;
        }

        myutils::set_socket_nonblock(*server, true);
        closesocket(sock);

        return true;
    }